

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O3

ssize_t __thiscall
capnp::
Request<capnproto_test::capnp::test::TestImplicitMethodParams::CallParams<capnp::Text,_capnproto_test::capnp::test::TestAllTypes>,_capnproto_test::capnp::test::TestGenerics<capnp::Text,_capnproto_test::capnp::test::TestAllTypes>_>
::send(Request<capnproto_test::capnp::test::TestImplicitMethodParams::CallParams<capnp::Text,_capnproto_test::capnp::test::TestAllTypes>,_capnproto_test::capnp::test::TestGenerics<capnp::Text,_capnproto_test::capnp::test::TestAllTypes>_>
       *this,int __fd,void *__buf,size_t __n,int __flags)

{
  long *plVar1;
  OwnPromiseNode node;
  void *pvVar2;
  WirePointer *pWVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 in_register_00000034;
  long lVar6;
  void *continuationTracePtr;
  anon_class_1_0_00000001_for_func local_49;
  code *local_48;
  OwnPromiseNode local_40;
  CapTableBuilder *local_38;
  void *pvStack_30;
  WirePointer *local_28;
  undefined8 uStack_20;
  Disposer *local_18;
  
  lVar6 = CONCAT44(in_register_00000034,__fd);
  (**(code **)**(undefined8 **)(lVar6 + 0x30))(&local_40);
  plVar1 = *(long **)(lVar6 + 0x30);
  if (plVar1 != (long *)0x0) {
    *(undefined8 *)(lVar6 + 0x30) = 0;
    (**(code **)**(undefined8 **)(lVar6 + 0x28))
              (*(undefined8 **)(lVar6 + 0x28),(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  local_48 = kj::_::
             SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.h:1087:13)>
             ::anon_class_1_0_00000001_for_func::operator();
  kj::_::PromiseDisposer::
  appendPromise<kj::_::SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,capnp::Request<capnproto_test::capnp::test::TestImplicitMethodParams::CallParams<capnp::Text,capnproto_test::capnp::test::TestAllTypes>,capnproto_test::capnp::test::TestGenerics<capnp::Text,capnproto_test::capnp::test::TestAllTypes>>::send()::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_>,kj::_::PromiseDisposer,capnp::Request<capnproto_test::capnp::test::TestImplicitMethodParams::CallParams<capnp::Text,capnproto_test::capnp::test::TestAllTypes>,capnproto_test::capnp::test::TestGenerics<capnp::Text,capnproto_test::capnp::test::TestAllTypes>>::send()::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_,void*&>
            ((PromiseDisposer *)this,&local_40,&local_49,&local_48);
  uVar4 = uStack_20;
  pWVar3 = local_28;
  pvVar2 = pvStack_30;
  node.ptr = local_40.ptr;
  local_28 = (WirePointer *)0x0;
  uStack_20 = 0;
  uVar5 = uStack_20;
  pvStack_30 = (void *)0x0;
  (this->super_Builder)._builder.capTable = local_38;
  (this->super_Builder)._builder.data = pvVar2;
  (this->super_Builder)._builder.pointers = pWVar3;
  uStack_20._0_4_ = (undefined4)uVar4;
  uStack_20._4_2_ = SUB82(uVar4,4);
  uStack_20._6_2_ = SUB82(uVar4,6);
  (this->super_Builder)._builder.dataSize = (undefined4)uStack_20;
  (this->super_Builder)._builder.pointerCount = uStack_20._4_2_;
  *(undefined2 *)&(this->super_Builder)._builder.field_0x26 = uStack_20._6_2_;
  (this->hook).disposer = local_18;
  if (&(local_40.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_40.ptr = (PromiseNode *)0x0;
    uStack_20 = uVar5;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  return (ssize_t)this;
}

Assistant:

RemotePromise<Results> Request<Params, Results>::send() {
  auto typelessPromise = hook->send();
  hook = nullptr;  // prevent reuse

  // Convert the Promise to return the correct response type.
  // Explicitly upcast to kj::Promise to make clear that calling .then() doesn't invalidate the
  // Pipeline part of the RemotePromise.
  auto typedPromise = kj::implicitCast<kj::Promise<Response<AnyPointer>>&>(typelessPromise)
      .then([](Response<AnyPointer>&& response) -> Response<Results> {
        return Response<Results>(response.getAs<Results>(), kj::mv(response.hook));
      });

  // Wrap the typeless pipeline in a typed wrapper.
  typename Results::Pipeline typedPipeline(
      kj::mv(kj::implicitCast<AnyPointer::Pipeline&>(typelessPromise)));

  return RemotePromise<Results>(kj::mv(typedPromise), kj::mv(typedPipeline));
}